

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

bool __thiscall
kj::anon_unknown_35::InMemoryDirectory::ReplacerImpl<kj::Directory>::tryCommit
          (ReplacerImpl<kj::Directory> *this)

{
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *this_00;
  Impl *this_01;
  InMemoryDirectory *pIVar1;
  size_t sVar2;
  Directory *pDVar3;
  int iVar4;
  Maybe<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> this_02;
  undefined4 extraout_var;
  char *pcVar5;
  bool bVar6;
  StringPtr name;
  Own<const_kj::Directory> result;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  Own<const_kj::Directory> local_68;
  Disposer *local_50;
  Directory *local_48;
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *local_40;
  Impl *local_38;
  
  if ((this->super_Replacer<kj::Directory>).field_0xc == '\x01') {
    (anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::Directory>::tryCommit();
    bVar6 = true;
  }
  else {
    pIVar1 = (this->directory).ptr;
    this_00 = &pIVar1->impl;
    _::Mutex::lock(&this_00->mutex,EXCLUSIVE);
    this_01 = &(pIVar1->impl).value;
    sVar2 = (this->name).content.size_;
    if (sVar2 == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (this->name).content.ptr;
    }
    name.content.size_ = sVar2 + (sVar2 == 0);
    name.content.ptr = pcVar5;
    local_40 = this_00;
    local_38 = this_01;
    this_02 = Impl::openEntry(this_01,name,(this->super_Replacer<kj::Directory>).mode);
    bVar6 = this_02.ptr != (EntryImpl *)0x0;
    if (bVar6) {
      (*(((this->inner).ptr)->super_ReadableDirectory).super_FsNode._vptr_FsNode[5])(&local_50);
      local_68.disposer = (Disposer *)0x0;
      local_68.ptr = (Directory *)0x0;
      if (local_48 != (Directory *)0x0) {
        local_68.ptr = local_48;
        local_68.disposer = local_50;
        local_48 = (Directory *)0x0;
      }
      pDVar3 = local_48;
      if (local_48 != (Directory *)0x0) {
        local_48 = (Directory *)0x0;
        (**local_50->_vptr_Disposer)
                  (local_50,(pDVar3->super_ReadableDirectory).super_FsNode._vptr_FsNode[-2] +
                            (long)&(pDVar3->super_ReadableDirectory).super_FsNode._vptr_FsNode);
      }
      EntryImpl::set(this_02.ptr,&local_68);
      if (local_68.ptr != (Directory *)0x0) {
        local_68.ptr = (Directory *)0x0;
        (**(local_68.disposer)->_vptr_Disposer)();
      }
      iVar4 = (**this_01->clock->_vptr_Clock)();
      (pIVar1->impl).value.lastModified.value.value = CONCAT44(extraout_var,iVar4);
    }
    _::Mutex::unlock(&this_00->mutex,EXCLUSIVE);
  }
  return bVar6;
}

Assistant:

bool tryCommit() override {
      KJ_REQUIRE(!committed, "commit() already called") { return true; }

      auto lock = directory->impl.lockExclusive();
      KJ_IF_MAYBE(entry, lock->openEntry(name, Replacer<T>::mode)) {
        entry->set(inner->clone());
        lock->modified();
        return true;
      } else {
        return false;
      }
    }